

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryDecoder.cc
# Opt level: O0

int64_t __thiscall avro::BinaryDecoder::doDecodeLong(BinaryDecoder *this)

{
  string *msg;
  ulong uVar1;
  int64_t iVar2;
  size_t in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  undefined8 in_RSI;
  long in_RDI;
  uint8_t u;
  int shift;
  uint64_t encoded;
  Exception *this_00;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  uint local_14;
  ulong local_10;
  
  local_10 = 0;
  local_14 = 0;
  do {
    if (0x3f < (int)local_14) {
      msg = (string *)__cxa_allocate_exception(0x18);
      this_00 = (Exception *)&stack0xffffffffffffffc7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      Exception::Exception(this_00,msg);
      __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
    }
    uVar1 = StreamReader::read((StreamReader *)(in_RDI + 8),(int)in_RSI,in_RDX,in_RCX);
    in_RCX = (size_t)local_14;
    local_10 = (long)(int)((byte)uVar1 & 0x7f) << ((byte)local_14 & 0x3f) | local_10;
    local_14 = local_14 + 7;
    in_RDX = extraout_RDX;
  } while ((uVar1 & 0x80) != 0);
  iVar2 = decodeZigzag64(local_10);
  return iVar2;
}

Assistant:

int64_t BinaryDecoder::doDecodeLong() {
    uint64_t encoded = 0;
    int shift = 0;
    uint8_t u;
    do {
        if (shift >= 64) {
            throw Exception("Invalid Avro varint");
        }
        u = in_.read();
        encoded |= static_cast<uint64_t>(u & 0x7f) << shift;
        shift += 7;
    } while (u & 0x80);

    return decodeZigzag64(encoded);
}